

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString<float>(void)

{
  size_type sVar1;
  size_type sVar2;
  String *in_RDI;
  String ret;
  String local_30;
  
  String::String(&local_30,"String doctest::toString() [T = float]");
  sVar1 = String::find(&local_30,'=',0);
  sVar2 = String::size(&local_30);
  String::substr(in_RDI,&local_30,sVar1 + 2,(sVar2 - sVar1) - 3);
  String::~String(&local_30);
  return in_RDI;
}

Assistant:

String toString() {
#if DOCTEST_CLANG == 0 && DOCTEST_GCC == 0 && DOCTEST_ICC == 0
    String ret = __FUNCSIG__; // class doctest::String __cdecl doctest::toString<TYPE>(void)
    String::size_type beginPos = ret.find('<');
    return ret.substr(beginPos + 1, ret.size() - beginPos - static_cast<String::size_type>(sizeof(">(void)")));
#else
    String ret = __PRETTY_FUNCTION__; // doctest::String toString() [with T = TYPE]
    String::size_type begin = ret.find('=') + 2;
    return ret.substr(begin, ret.size() - begin - 1);
#endif
}